

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_shift_l(mbedtls_mpi *X,size_t count)

{
  ushort uVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar3 = mbedtls_mpi_core_bitlen(X->p,(ulong)X->n);
  uVar4 = sVar3 + count;
  uVar1 = X->n;
  if ((ulong)uVar1 << 6 < uVar4) {
    iVar2 = mbedtls_mpi_grow(X,((uVar4 >> 6) + 1) - (ulong)((uVar4 & 0x3f) == 0));
    if (iVar2 != 0) {
      return iVar2;
    }
    uVar1 = X->n;
  }
  mbedtls_mpi_core_shift_l(X->p,(ulong)uVar1,count);
  return 0;
}

Assistant:

int mbedtls_mpi_shift_l(mbedtls_mpi *X, size_t count)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    MPI_VALIDATE_RET(X != NULL);

    i = mbedtls_mpi_bitlen(X) + count;

    if (X->n * biL < i) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, BITS_TO_LIMBS(i)));
    }

    ret = 0;

    mbedtls_mpi_core_shift_l(X->p, X->n, count);
cleanup:

    return ret;
}